

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operators.hpp
# Opt level: O0

ModulePtr chaiscript::bootstrap::operators::assign<bool>(ModulePtr *m)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *in_RSI;
  Module *in_RDI;
  ModulePtr MVar1;
  shared_ptr<chaiscript::Module> *in_stack_ffffffffffffff78;
  Module *this;
  allocator local_41;
  string local_40 [64];
  
  this = in_RDI;
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x35b803);
  fun<bool&,bool&,bool_const&>((_func_bool_ptr_bool_ptr_bool_ptr *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"=",&local_41);
  Module::add(this,(Proxy_Function *)in_RDI,in_RSI);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x35b874);
  std::shared_ptr<chaiscript::Module>::shared_ptr
            ((shared_ptr<chaiscript::Module> *)in_RSI,in_stack_ffffffffffffff78);
  MVar1.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  MVar1.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (ModulePtr)MVar1.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ModulePtr assign(ModulePtr m = std::make_shared<Module>())
        {
          m->add(chaiscript::fun(&detail::assign<T &, const T&>), "=");
          return m;
        }